

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  element_type *peVar4;
  byte local_dd;
  undefined1 local_d0 [8];
  ConsoleAssertionPrinter printer;
  bool includeResults;
  AssertionResult *result;
  AssertionStats *_assertionStats_local;
  ConsoleReporter *this_local;
  
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config);
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[5])();
  local_dd = 1;
  if ((uVar2 & 1) == 0) {
    bVar1 = AssertionResult::isOk(&_assertionStats->assertionResult);
    local_dd = bVar1 ^ 0xff;
  }
  printer._159_1_ = local_dd & 1;
  if ((printer._159_1_ == 0) &&
     (OVar3 = AssertionResult::getResultType(&_assertionStats->assertionResult), OVar3 != Warning))
  {
    return false;
  }
  lazyPrint(this);
  anon_unknown_1::ConsoleAssertionPrinter::ConsoleAssertionPrinter
            ((ConsoleAssertionPrinter *)local_d0,
             (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,_assertionStats,
             (bool)(printer._159_1_ & 1));
  anon_unknown_1::ConsoleAssertionPrinter::print((ConsoleAssertionPrinter *)local_d0);
  std::ostream::operator<<
            ((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
             std::endl<char,std::char_traits<char>>);
  anon_unknown_1::ConsoleAssertionPrinter::~ConsoleAssertionPrinter
            ((ConsoleAssertionPrinter *)local_d0);
  return true;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    if (!includeResults && result.getResultType() != ResultWas::Warning)
        return false;

    lazyPrint();

    ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
    printer.print();
    stream << std::endl;
    return true;
}